

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setControlDesiredTrajectory
          (L2NormCost *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *controlDesiredTrajectory)

{
  bool bVar1;
  CostAttributes *this_00;
  __shared_ptr *in_RSI;
  long in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
  *in_stack_ffffffffffffff98;
  bool local_1;
  
  bVar1 = CostAttributes::isValid((CostAttributes *)(*(long *)(in_RDI + 0x28) + 0x128));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      this_00 = (CostAttributes *)(*(long *)(in_RDI + 0x28) + 0x128);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                  *)this_00,in_stack_ffffffffffffff98);
      local_1 = CostAttributes::setDesiredTrajectory(this_00,in_stack_ffffffffffffff98);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                   *)0x34c3f5);
    }
    else {
      iDynTree::reportError
                ("L2NormCost","setControlDesiredTrajectory","Empty desired trajectory pointer.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("L2NormCost","setControlDesiredTrajectory",
               "The control cost portion has been deactivated, given the provided selectors.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool L2NormCost::setControlDesiredTrajectory(std::shared_ptr<TimeVaryingVector> controlDesiredTrajectory)
        {
            if (!(m_pimpl->controlCost.isValid())) {
                reportError("L2NormCost", "setControlDesiredTrajectory", "The control cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!controlDesiredTrajectory) {
                reportError("L2NormCost", "setControlDesiredTrajectory", "Empty desired trajectory pointer.");
                return false;
            }

            return m_pimpl->controlCost.setDesiredTrajectory(controlDesiredTrajectory);
        }